

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_mul_30
               (secp256k1_modinv32_signed30 *r,secp256k1_modinv32_signed30 *a,int alen,
               int32_t factor)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  int64_t c;
  int32_t M30;
  int local_2c;
  long local_28;
  
  local_28 = 0;
  for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
    if (local_2c < in_EDX) {
      local_28 = (long)*(int *)(in_RSI + (long)local_2c * 4) * (long)in_ECX + local_28;
    }
    *(uint *)(in_RDI + (long)local_2c * 4) = (uint)local_28 & 0x3fffffff;
    local_28 = local_28 >> 0x1e;
  }
  if (8 < in_EDX) {
    local_28 = (long)*(int *)(in_RSI + 0x20) * (long)in_ECX + local_28;
  }
  if (local_28 != (int)local_28) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv32_impl.h"
            ,0x24,"test condition failed: c == (int32_t)c");
    abort();
  }
  *(int *)(in_RDI + 0x20) = (int)local_28;
  return;
}

Assistant:

static void secp256k1_modinv32_mul_30(secp256k1_modinv32_signed30 *r, const secp256k1_modinv32_signed30 *a, int alen, int32_t factor) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int64_t c = 0;
    int i;
    for (i = 0; i < 8; ++i) {
        if (i < alen) c += (int64_t)a->v[i] * factor;
        r->v[i] = (int32_t)c & M30; c >>= 30;
    }
    if (8 < alen) c += (int64_t)a->v[8] * factor;
    VERIFY_CHECK(c == (int32_t)c);
    r->v[8] = (int32_t)c;
}